

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::initialize(DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
             *this)

{
  Counter *this_00;
  bool bVar1;
  ParamNames *name;
  vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
  local_180;
  ExprP<tcu::Vector<float,_4>_> local_168;
  VariableP<vkt::shaderexecutor::Void> local_158;
  ExprP<vkt::shaderexecutor::Void> local_148;
  VariableP<vkt::shaderexecutor::Void> local_138;
  ExprP<vkt::shaderexecutor::Void> local_128;
  VariableP<tcu::Vector<float,_4>_> local_118;
  ExprP<tcu::Vector<float,_4>_> local_108;
  VariableP<tcu::Vector<float,_4>_> local_f8;
  ExprP<tcu::Vector<float,_4>_> local_e8;
  ExprP<vkt::shaderexecutor::Void> local_d8;
  ExprP<vkt::shaderexecutor::Void> local_c8;
  ExprP<tcu::Vector<float,_4>_> local_b8 [2];
  ExprP<tcu::Vector<float,_4>_> local_98;
  undefined1 local_80 [8];
  ArgExprs args;
  ExpandContext ctx;
  Counter symCounter;
  ParamNames *paramNames;
  DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_ret);
  if (!bVar1) {
    name = Func<vkt::shaderexecutor::Signature<tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
           ::getParamNames_abi_cxx11_
                     ((Func<vkt::shaderexecutor::Signature<tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                       *)this);
    this_00 = (Counter *)
              ((long)&ctx.m_statements.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    Counter::Counter(this_00,0);
    ExpandContext::ExpandContext
              ((ExpandContext *)
               &args.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                super_ExprPBase<vkt::shaderexecutor::Void>.
                super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state
               ,this_00);
    local_98.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
    super_ExprPBase<tcu::Vector<float,_4>_>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_ptr =
         (Expr<tcu::Vector<float,_4>_> *)0x0;
    local_98.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
    super_ExprPBase<tcu::Vector<float,_4>_>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_state =
         (SharedPtrStateBase *)0x0;
    ExprP<tcu::Vector<float,_4>_>::ExprP(&local_98);
    local_b8[0].super_ContainerExprPBase<tcu::Vector<float,_4>_>.
    super_ExprPBase<tcu::Vector<float,_4>_>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_ptr =
         (Expr<tcu::Vector<float,_4>_> *)0x0;
    local_b8[0].super_ContainerExprPBase<tcu::Vector<float,_4>_>.
    super_ExprPBase<tcu::Vector<float,_4>_>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_state =
         (SharedPtrStateBase *)0x0;
    ExprP<tcu::Vector<float,_4>_>::ExprP(local_b8);
    local_c8.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
    super_ExprPBase<vkt::shaderexecutor::Void>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr =
         (Expr<vkt::shaderexecutor::Void> *)0x0;
    local_c8.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
    super_ExprPBase<vkt::shaderexecutor::Void>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state =
         (SharedPtrStateBase *)0x0;
    ExprP<vkt::shaderexecutor::Void>::ExprP(&local_c8);
    local_d8.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
    super_ExprPBase<vkt::shaderexecutor::Void>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr =
         (Expr<vkt::shaderexecutor::Void> *)0x0;
    local_d8.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
    super_ExprPBase<vkt::shaderexecutor::Void>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state =
         (SharedPtrStateBase *)0x0;
    ExprP<vkt::shaderexecutor::Void>::ExprP(&local_d8);
    Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_4>_>,_vkt::shaderexecutor::ExprP<tcu::Vector<float,_4>_>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
    ::Tuple4((Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_4>_>,_vkt::shaderexecutor::ExprP<tcu::Vector<float,_4>_>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
              *)local_80,&local_98,local_b8,&local_c8,&local_d8);
    ExprP<vkt::shaderexecutor::Void>::~ExprP(&local_d8);
    ExprP<vkt::shaderexecutor::Void>::~ExprP(&local_c8);
    ExprP<tcu::Vector<float,_4>_>::~ExprP(local_b8);
    ExprP<tcu::Vector<float,_4>_>::~ExprP(&local_98);
    variable<tcu::Vector<float,4>>((shaderexecutor *)&local_f8,&name->a);
    VariableP<tcu::Vector<float,_4>_>::operator=(&this->m_var0,&local_f8);
    shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_e8);
    ExprP<tcu::Vector<float,_4>_>::operator=((ExprP<tcu::Vector<float,_4>_> *)local_80,&local_e8);
    ExprP<tcu::Vector<float,_4>_>::~ExprP(&local_e8);
    VariableP<tcu::Vector<float,_4>_>::~VariableP(&local_f8);
    variable<tcu::Vector<float,4>>((shaderexecutor *)&local_118,&name->b);
    VariableP<tcu::Vector<float,_4>_>::operator=(&this->m_var1,&local_118);
    shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_108);
    ExprP<tcu::Vector<float,_4>_>::operator=
              ((ExprP<tcu::Vector<float,_4>_> *)
               &args.a.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
                super_ExprPBase<tcu::Vector<float,_4>_>.
                super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_state,
               &local_108);
    ExprP<tcu::Vector<float,_4>_>::~ExprP(&local_108);
    VariableP<tcu::Vector<float,_4>_>::~VariableP(&local_118);
    variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_138,&name->c);
    VariableP<vkt::shaderexecutor::Void>::operator=(&this->m_var2,&local_138);
    shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_128);
    ExprP<vkt::shaderexecutor::Void>::operator=
              ((ExprP<vkt::shaderexecutor::Void> *)
               &args.b.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
                super_ExprPBase<tcu::Vector<float,_4>_>.
                super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_state,
               &local_128);
    ExprP<vkt::shaderexecutor::Void>::~ExprP(&local_128);
    VariableP<vkt::shaderexecutor::Void>::~VariableP(&local_138);
    variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_158,&name->d);
    VariableP<vkt::shaderexecutor::Void>::operator=(&this->m_var3,&local_158);
    shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_148);
    ExprP<vkt::shaderexecutor::Void>::operator=
              ((ExprP<vkt::shaderexecutor::Void> *)
               &args.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                super_ExprPBase<vkt::shaderexecutor::Void>.
                super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state
               ,&local_148);
    ExprP<vkt::shaderexecutor::Void>::~ExprP(&local_148);
    VariableP<vkt::shaderexecutor::Void>::~VariableP(&local_158);
    (*(this->
      super_Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ).super_FuncBase._vptr_FuncBase[0xb])
              (&local_168,this,
               &args.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                super_ExprPBase<vkt::shaderexecutor::Void>.
                super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state
               ,local_80);
    ExprP<tcu::Vector<float,_4>_>::operator=(&this->m_ret,&local_168);
    ExprP<tcu::Vector<float,_4>_>::~ExprP(&local_168);
    ExpandContext::getStatements
              (&local_180,
               (ExpandContext *)
               &args.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                super_ExprPBase<vkt::shaderexecutor::Void>.
                super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state
              );
    std::vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>::
    operator=(&this->m_body,&local_180);
    std::vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>::
    ~vector(&local_180);
    Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_4>_>,_vkt::shaderexecutor::ExprP<tcu::Vector<float,_4>_>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
    ::~Tuple4((Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_4>_>,_vkt::shaderexecutor::ExprP<tcu::Vector<float,_4>_>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
               *)local_80);
    ExpandContext::~ExpandContext
              ((ExpandContext *)
               &args.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                super_ExprPBase<vkt::shaderexecutor::Void>.
                super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state
              );
  }
  return;
}

Assistant:

void				initialize		(void)	const
	{
		if (!m_ret)
		{
			const ParamNames&	paramNames	= this->getParamNames();
			Counter				symCounter;
			ExpandContext		ctx			(symCounter);
			ArgExprs			args;

			args.a	= m_var0 = variable<Arg0>(paramNames.a);
			args.b	= m_var1 = variable<Arg1>(paramNames.b);
			args.c	= m_var2 = variable<Arg2>(paramNames.c);
			args.d	= m_var3 = variable<Arg3>(paramNames.d);

			m_ret	= this->doExpand(ctx, args);
			m_body	= ctx.getStatements();
		}
	}